

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Functional::anon_unknown_0::ShaderTypeCase::test(ShaderTypeCase *this)

{
  CallLogWrapper *this_00;
  GLuint GVar1;
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    this_00,GVar1,0x8b4f,0x8b31);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
  GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    this_00,GVar1,0x8b4f,0x8b30);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
  return;
}

Assistant:

void test (void)
	{
		const GLenum shaderTypes[] = {GL_VERTEX_SHADER, GL_FRAGMENT_SHADER};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ++ndx)
		{
			const GLuint shader = glCreateShader(shaderTypes[ndx]);
			verifyShaderParam(m_testCtx, *this, shader, GL_SHADER_TYPE, shaderTypes[ndx]);
			glDeleteShader(shader);
		}
	}